

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int selectExpander(Walker *pWalker,Select *p)

{
  byte *pbVar1;
  Expr **ppWhere;
  undefined1 *puVar2;
  char **ppcVar3;
  char cVar4;
  i16 iVar5;
  Parse *pParse;
  sqlite3 *db;
  With *pWVar6;
  sqlite3 *db_00;
  Schema *pSVar7;
  Schema *pSVar8;
  ExprList *pEVar9;
  ExprList *pEVar10;
  SrcList *pSrc;
  Column *pCVar11;
  bool bVar12;
  byte bVar13;
  int iVar14;
  int iVar15;
  Table *pTVar16;
  char *pcVar17;
  Select *pSVar18;
  ulong uVar19;
  Expr *pEVar20;
  Expr *pEVar21;
  uint uVar22;
  uint uVar23;
  SrcList_item *pSVar24;
  SrcList_item *pSVar25;
  SrcList *pSVar26;
  char *pcVar27;
  Select *pSVar28;
  Hash *pHVar29;
  ExprList_item *pEVar30;
  int iVar31;
  long lVar32;
  long lVar33;
  ExprList *pEList;
  Parse *pParse_00;
  Select *pSVar34;
  bool bVar35;
  ExprList *local_e0;
  SrcList_item *local_c8;
  uint local_bc;
  char *local_a8;
  int iLeftCol;
  SrcList_item *local_90;
  Select *local_88;
  SrcList *local_80;
  int local_74;
  ExprList *local_70;
  char *local_68;
  int iLeft;
  uint local_58;
  ExprList_item *local_50;
  char *local_48;
  long local_40;
  SrcList_item *local_38;
  
  pParse = pWalker->pParse;
  db = pParse->db;
  uVar22 = p->selFlags;
  p->selFlags = uVar22 | 0x40;
  if (db->mallocFailed != '\0') {
    return 2;
  }
  if ((uVar22 & 0x40) != 0) {
    return 1;
  }
  local_70 = p->pEList;
  pSVar26 = p->pSrc;
  pWVar6 = p->pWith;
  if (pWVar6 != (With *)0x0) {
    pWVar6->pOuter = pParse->pWith;
    pParse->pWith = pWVar6;
  }
  local_88 = p;
  local_80 = pSVar26;
  sqlite3SrcListAssignCursors(pParse,pSVar26);
  pSVar24 = pSVar26->a;
  local_38 = pSVar24;
  for (iVar31 = 0; iVar31 < local_80->nSrc; iVar31 = iVar31 + 1) {
    if (((pSVar24->fg).field_0x1 & 0x20) == 0) {
      if ((pSVar24->zDatabase == (char *)0x0) && (pcVar17 = pSVar24->zName, pcVar17 != (char *)0x0))
      {
        pParse_00 = pWalker->pParse;
        db_00 = pParse_00->db;
        pHVar29 = (Hash *)&pParse_00->pWith;
        local_90 = (SrcList_item *)pHVar29;
        while (pSVar7 = *(Schema **)&pHVar29->htsize, pSVar7 != (Schema *)0x0) {
          uVar22 = pSVar7->schema_cookie;
          if (pSVar7->schema_cookie < 1) {
            uVar22 = 0;
          }
          lVar32 = 0;
          while (lVar33 = lVar32, (ulong)uVar22 * 0x20 + 0x20 != lVar33 + 0x20) {
            pcVar27 = *(char **)((long)&((Cte *)&(pSVar7->tblHash).first)->zName + lVar33);
            iVar14 = sqlite3StrICmp(pcVar17,pcVar27);
            lVar32 = lVar33 + 0x20;
            if (iVar14 == 0) {
              pcVar17 = *(char **)((long)&(pSVar7->idxHash).first + lVar33);
              if (pcVar17 == (char *)0x0) {
                iVar14 = cannotBeFunction(pParse_00,pSVar24);
                if (iVar14 != 0) {
                  return 2;
                }
                pTVar16 = (Table *)sqlite3DbMallocZero(db_00,0x80);
                pSVar24->pTab = pTVar16;
                if (pTVar16 == (Table *)0x0) {
                  return 2;
                }
                pTVar16->nTabRef = 1;
                pcVar17 = sqlite3DbStrDup(db_00,*(char **)((long)&((Cte *)&(pSVar7->tblHash).first)
                                                                  ->zName + lVar33));
                pTVar16->zName = pcVar17;
                pTVar16->iPKey = -1;
                pTVar16->nRowLogEst = 200;
                *(byte *)&pTVar16->tabFlags = (byte)pTVar16->tabFlags | 0x42;
                pSVar18 = sqlite3SelectDup(db_00,*(Select **)
                                                  ((long)&(pSVar7->idxHash).htsize + lVar33),0);
                pSVar24->pSelect = pSVar18;
                if (db_00->mallocFailed != '\0') {
                  return 2;
                }
                bVar13 = pSVar18->op + 0x85;
                if (bVar13 < 2) {
                  pSVar26 = pSVar18->pSrc;
                  uVar19 = (ulong)(uint)pSVar26->nSrc;
                  if (pSVar26->nSrc < 1) {
                    uVar19 = 0;
                  }
                  for (lVar32 = 0; uVar19 * 0x70 - lVar32 != 0; lVar32 = lVar32 + 0x70) {
                    if (((*(long *)((long)&pSVar26->a[0].zDatabase + lVar32) == 0) &&
                        (pcVar17 = *(char **)((long)&pSVar26->a[0].zName + lVar32),
                        pcVar17 != (char *)0x0)) &&
                       (iVar14 = sqlite3StrICmp(pcVar17,*(char **)((long)&((Cte *)&(pSVar7->tblHash)
                                                                                   .first)->zName +
                                                                  lVar33)), iVar14 == 0)) {
                      *(Table **)((long)&pSVar26->a[0].pTab + lVar32) = pTVar16;
                      pbVar1 = &pSVar26->a[0].fg.field_0x1 + lVar32;
                      *pbVar1 = *pbVar1 | 0x20;
                      pTVar16->nTabRef = pTVar16->nTabRef + 1;
                      pbVar1 = (byte *)((long)&pSVar18->selFlags + 1);
                      *pbVar1 = *pbVar1 | 0x20;
                    }
                  }
                }
                pSVar25 = local_90;
                if (2 < pTVar16->nTabRef) {
                  pcVar27 = *(char **)((long)&((Cte *)&(pSVar7->tblHash).first)->zName + lVar33);
                  pcVar17 = "multiple references to recursive table: %s";
                  goto LAB_0016714d;
                }
                *(char **)((long)&(pSVar7->idxHash).first + lVar33) = "circular reference: %s";
                pSVar8 = local_90->pSchema;
                local_90->pSchema = pSVar7;
                if (bVar13 < 2) {
                  pSVar28 = pSVar18->pPrior;
                  pSVar28->pWith = pSVar18->pWith;
                  sqlite3WalkSelect(pWalker,pSVar28);
                  pSVar28->pWith = (With *)0x0;
                  pSVar25 = local_90;
                }
                else {
                  sqlite3WalkSelect(pWalker,pSVar18);
                }
                pSVar25->pSchema = pSVar7;
                pSVar28 = pSVar18;
                do {
                  pSVar34 = pSVar28;
                  pSVar28 = pSVar34->pPrior;
                } while (pSVar28 != (Select *)0x0);
                pEVar9 = pSVar34->pEList;
                pEVar10 = *(ExprList **)((long)&(pSVar7->tblHash).ht + lVar33);
                pEList = pEVar9;
                if (((pEVar10 != (ExprList *)0x0) && (pEList = pEVar10, pEVar9 != (ExprList *)0x0))
                   && (pEVar9->nExpr != pEVar10->nExpr)) {
                  sqlite3ErrorMsg(pParse_00,"table %s has %d values for %d columns",
                                  *(undefined8 *)
                                   ((long)&((Cte *)&(pSVar7->tblHash).first)->zName + lVar33));
                  pParse_00->pWith = (With *)pSVar8;
                  return 2;
                }
                sqlite3ColumnsFromExprList(pParse_00,pEList,&pTVar16->nCol,&pTVar16->aCol);
                if (bVar13 < 2) {
                  pcVar17 = "multiple recursive references: %s";
                  if ((pSVar18->selFlags >> 0xd & 1) == 0) {
                    pcVar17 = "recursive reference in a subquery: %s";
                  }
                  *(char **)((long)&(pSVar7->idxHash).first + lVar33) = pcVar17;
                  sqlite3WalkSelect(pWalker,pSVar18);
                }
                *(undefined8 *)((long)&(pSVar7->idxHash).first + lVar33) = 0;
                pSVar25->pSchema = pSVar8;
                goto LAB_00166dcb;
              }
              goto LAB_0016714d;
            }
          }
          pHVar29 = &pSVar7->tblHash;
        }
      }
LAB_00166dcb:
      if (pSVar24->pTab == (Table *)0x0) {
        if (pSVar24->zName == (char *)0x0) {
          iVar14 = sqlite3WalkSelect(pWalker,pSVar24->pSelect);
          if (iVar14 != 0) {
            return 2;
          }
          iVar14 = sqlite3ExpandSubquery(pParse,pSVar24);
          if (iVar14 != 0) {
            return 2;
          }
        }
        else {
          pTVar16 = sqlite3LocateTableItem(pParse,0,pSVar24);
          pSVar24->pTab = pTVar16;
          if (pTVar16 == (Table *)0x0) {
            return 2;
          }
          if (0xfffe < pTVar16->nTabRef) {
            sqlite3ErrorMsg(pParse,"too many references to \"%s\": max 65535",pTVar16->zName);
            pSVar24->pTab = (Table *)0x0;
            return 2;
          }
          pTVar16->nTabRef = pTVar16->nTabRef + 1;
          if (pTVar16->nModuleArg == 0) {
            iVar14 = cannotBeFunction(pParse,pSVar24);
            if (iVar14 != 0) {
              return 2;
            }
            if ((pTVar16->nModuleArg == 0) && (pTVar16->pSelect == (Select *)0x0))
            goto LAB_00166ea5;
          }
          iVar14 = sqlite3ViewGetColumnNames(pParse,pTVar16);
          if (iVar14 != 0) {
            return 2;
          }
          pSVar18 = sqlite3SelectDup(db,pTVar16->pSelect,0);
          pSVar24->pSelect = pSVar18;
          iVar5 = pTVar16->nCol;
          pTVar16->nCol = -1;
          sqlite3WalkSelect(pWalker,pSVar18);
          pTVar16->nCol = iVar5;
        }
      }
LAB_00166ea5:
      iVar14 = sqlite3IndexedByLookup(pParse,pSVar24);
      if (iVar14 != 0) {
        return 2;
      }
    }
    pSVar24 = pSVar24 + 1;
  }
  if (db->mallocFailed != '\0') {
    return 2;
  }
  pSrc = local_88->pSrc;
  pSVar24 = pSrc->a;
  pSVar26 = pSrc + 1;
  ppWhere = &local_88->pWhere;
  pSVar18 = local_88;
  for (iVar31 = 0; iVar31 < pSrc->nSrc + -1; iVar31 = iVar31 + 1) {
    pTVar16 = (Table *)pSVar26->a[0].zAlias;
    local_90 = pSVar24;
    if (pTVar16 != (Table *)0x0 && pSVar24->pTab != (Table *)0x0) {
      bVar13 = (byte)pSVar26->a[0].regReturn;
      uVar22 = (bVar13 & 0x20) >> 5;
      if ((bVar13 & 4) != 0) {
        if ((*(long *)&pSVar26->a[0].iCursor != 0) || (pSVar26->a[0].pOn != (Expr *)0x0)) {
          sqlite3ErrorMsg(pParse,"a NATURAL join may not have an ON or USING clause",0);
          return 2;
        }
        lVar33 = 0;
        for (lVar32 = 0; lVar32 < pTVar16->nCol; lVar32 = lVar32 + 1) {
          iVar14 = tableAndColumnIndex(pSrc,iVar31 + 1,
                                       *(char **)((long)&pTVar16->aCol->zName + lVar33),&iLeft,
                                       &iLeftCol);
          if (iVar14 != 0) {
            addWhereTerm(pParse,pSrc,iLeft,iLeftCol,iVar31 + 1,(int)lVar32,uVar22,ppWhere);
          }
          lVar33 = lVar33 + 0x20;
        }
      }
      pEVar20 = *(Expr **)&pSVar26->a[0].iCursor;
      if (pEVar20 != (Expr *)0x0) {
        if (pSVar26->a[0].pOn != (Expr *)0x0) {
          sqlite3ErrorMsg(pParse,"cannot have both ON and USING clauses in the same join");
          return 2;
        }
        if ((bVar13 & 0x20) != 0) {
          setJoinExpr(pEVar20,pSVar26->a[0].regResult);
          pEVar20 = *(Expr **)&pSVar26->a[0].iCursor;
        }
        pEVar20 = sqlite3ExprAnd(pParse->db,*ppWhere,pEVar20);
        *ppWhere = pEVar20;
        *(undefined8 *)&pSVar26->a[0].iCursor = 0;
      }
      pEVar20 = pSVar26->a[0].pOn;
      pSVar18 = local_88;
      if (pEVar20 != (Expr *)0x0) {
        lVar32 = 0;
        for (lVar33 = 0; pSVar18 = local_88, lVar33 < (pEVar20->u).iValue; lVar33 = lVar33 + 1) {
          pcVar27 = *(char **)(*(long *)pEVar20 + lVar32);
          iVar14 = columnIndex(pTVar16,pcVar27);
          if ((iVar14 < 0) ||
             (iVar15 = tableAndColumnIndex(pSrc,iVar31 + 1,pcVar27,&iLeft,&iLeftCol), iVar15 == 0))
          {
            pcVar17 = "cannot join using column %s - column not present in both tables";
            pParse_00 = pParse;
LAB_0016714d:
            sqlite3ErrorMsg(pParse_00,pcVar17,pcVar27);
            return 2;
          }
          addWhereTerm(pParse,pSrc,iLeft,iLeftCol,iVar31 + 1,iVar14,uVar22,ppWhere);
          lVar32 = lVar32 + 0x10;
        }
      }
    }
    pSVar26 = (SrcList *)&pSVar26->a[0].pIBIndex;
    pSVar24 = local_90 + 1;
  }
  uVar22 = local_70->nExpr;
  local_50 = local_70->a;
  lVar32 = 0;
  uVar19 = 0;
  if (0 < (int)uVar22) {
    uVar19 = (ulong)uVar22;
  }
  local_bc = 0;
  for (; uVar19 * 0x20 != lVar32; lVar32 = lVar32 + 0x20) {
    pcVar17 = *(char **)((long)&local_70->a[0].pExpr + lVar32);
    cVar4 = *pcVar17;
    if (cVar4 == -0x7e) {
      cVar4 = **(char **)(pcVar17 + 0x18);
    }
    if (cVar4 == -0x58) {
      uVar23 = (uint)pParse->db->flags & 0x44;
      lVar32 = 0;
      local_e0 = (ExprList *)0x0;
      goto LAB_00167226;
    }
    local_bc = local_bc | *(uint *)(pcVar17 + 4);
  }
  local_e0 = pSVar18->pEList;
LAB_0016767c:
  if (local_e0 != (ExprList *)0x0) {
    if (db->aLimit[2] < local_e0->nExpr) {
      sqlite3ErrorMsg(pParse,"too many columns in result set");
      return 2;
    }
    if ((local_bc & 0x200004) != 0) {
      pbVar1 = (byte *)((long)&pSVar18->selFlags + 2);
      *pbVar1 = *pbVar1 | 4;
    }
  }
  return 0;
LAB_00167226:
  if ((int)uVar22 <= lVar32) goto LAB_00167665;
  pEVar20 = local_50[lVar32].pExpr;
  local_bc = local_bc | pEVar20->flags;
  local_40 = lVar32;
  if (pEVar20->op == 0xa8) {
    pcVar17 = (char *)0x0;
LAB_001672bd:
    bVar12 = false;
    local_c8 = local_38;
    local_48 = pcVar17;
    for (iVar31 = 0; iVar31 < local_80->nSrc; iVar31 = iVar31 + 1) {
      local_a8 = local_c8->zAlias;
      pTVar16 = local_c8->pTab;
      if (local_a8 == (char *)0x0) {
        local_a8 = pTVar16->zName;
      }
      if (db->mallocFailed != '\0') break;
      pSVar28 = local_c8->pSelect;
      if ((pSVar28 == (Select *)0x0) || ((pSVar28->selFlags & 0x800) == 0)) {
        if ((pcVar17 == (char *)0x0) || (iVar14 = sqlite3StrICmp(pcVar17,local_a8), iVar14 == 0)) {
          uVar22 = sqlite3SchemaToIndex(db,pTVar16->pSchema);
          if ((int)uVar22 < 0) {
            pSVar28 = (Select *)0x0;
            local_68 = "*";
          }
          else {
            local_68 = db->aDb[uVar22].zDbSName;
            pSVar28 = (Select *)0x0;
          }
          goto LAB_001673a4;
        }
      }
      else {
        local_68 = (char *)0x0;
LAB_001673a4:
        bVar35 = pcVar17 == (char *)0x0;
        local_90 = (SrcList_item *)CONCAT71(local_90._1_7_,iVar31 != 0 && bVar35);
        lVar33 = 0;
        local_74 = iVar31;
        for (lVar32 = 0; pcVar17 = local_48, iVar31 = local_74, lVar32 < pTVar16->nCol;
            lVar32 = lVar32 + 1) {
          pCVar11 = pTVar16->aCol;
          pcVar17 = *(char **)((long)&pCVar11->zName + lVar33);
          if (((pSVar28 == (Select *)0x0 || bVar35) ||
              (iVar31 = sqlite3MatchSpanName
                                  (*(char **)((long)&pSVar28->pEList->a[0].zSpan + lVar33),
                                   (char *)0x0,local_48,(char *)0x0), iVar31 != 0)) &&
             (((pSVar18->selFlags & 0x20000) != 0 || (((&pCVar11->colFlags)[lVar33] & 2) == 0)))) {
            if (((char)local_90 == '\0') ||
               (((((local_c8->fg).jointype & 4) == 0 ||
                 (iVar31 = tableAndColumnIndex(local_80,local_74,pcVar17,(int *)0x0,(int *)0x0),
                 iVar31 == 0)) &&
                (iVar31 = sqlite3IdListIndex(local_c8->pUsing,pcVar17), iVar31 < 0)))) {
              pEVar20 = sqlite3Expr(db,0x3b,pcVar17);
              if ((uVar23 == 4) || (1 < local_80->nSrc)) {
                pEVar21 = sqlite3Expr(db,0x3b,local_a8);
                pEVar20 = sqlite3PExpr(pParse,0x82,pEVar21,pEVar20);
                if (local_68 != (char *)0x0) {
                  pEVar21 = sqlite3Expr(db,0x3b,local_68);
                  pEVar20 = sqlite3PExpr(pParse,0x82,pEVar21,pEVar20);
                }
                if (uVar23 != 4) goto LAB_0016751e;
                pcVar17 = sqlite3MPrintf(db,"%s.%s",local_a8);
                pcVar27 = pcVar17;
              }
              else {
LAB_0016751e:
                pcVar27 = (char *)0x0;
              }
              local_e0 = sqlite3ExprListAppend(pParse,local_e0,pEVar20);
              _iLeft = pcVar17;
              local_58 = sqlite3Strlen30(pcVar17);
              sqlite3ExprListSetName(pParse,local_e0,(Token *)&iLeft,0);
              pSVar18 = local_88;
              if ((local_e0 != (ExprList *)0x0) && ((local_88->selFlags & 0x800) != 0)) {
                iVar31 = local_e0->nExpr;
                if (pSVar28 == (Select *)0x0) {
                  pcVar17 = sqlite3MPrintf(db,"%s.%s.%s",local_68,local_a8);
                }
                else {
                  pcVar17 = sqlite3DbStrDup(db,*(char **)((long)&pSVar28->pEList->a[0].zSpan +
                                                         lVar33));
                }
                local_e0->a[(long)iVar31 + -1].zSpan = pcVar17;
                puVar2 = &local_e0->a[(long)iVar31 + -1].field_0x19;
                *puVar2 = *puVar2 | 2;
              }
              sqlite3DbFree(db,pcVar27);
            }
            bVar12 = true;
          }
          lVar33 = lVar33 + 0x20;
        }
      }
      local_c8 = local_c8 + 1;
    }
    if (!bVar12) {
      if (pcVar17 == (char *)0x0) {
        sqlite3ErrorMsg(pParse,"no tables specified");
      }
      else {
        sqlite3ErrorMsg(pParse,"no such table: %s",pcVar17);
      }
    }
  }
  else {
    if ((pEVar20->op == 0x82) && (pEVar20->pRight->op == 0xa8)) {
      pcVar17 = (pEVar20->pLeft->u).zToken;
      goto LAB_001672bd;
    }
    pEVar30 = local_50 + lVar32;
    local_e0 = sqlite3ExprListAppend(pParse,local_e0,pEVar20);
    if (local_e0 != (ExprList *)0x0) {
      pcVar17 = pEVar30->zSpan;
      ppcVar3 = &local_e0->a[(long)local_e0->nExpr + -1].zName;
      *ppcVar3 = pEVar30->zName;
      ppcVar3[1] = pcVar17;
      pEVar30->zName = (char *)0x0;
      pEVar30->zSpan = (char *)0x0;
    }
    pEVar30->pExpr = (Expr *)0x0;
  }
  lVar32 = local_40 + 1;
  uVar22 = local_70->nExpr;
  goto LAB_00167226;
LAB_00167665:
  exprListDeleteNN(db,local_70);
  pSVar18->pEList = local_e0;
  goto LAB_0016767c;
}

Assistant:

static int selectExpander(Walker *pWalker, Select *p){
  Parse *pParse = pWalker->pParse;
  int i, j, k;
  SrcList *pTabList;
  ExprList *pEList;
  struct SrcList_item *pFrom;
  sqlite3 *db = pParse->db;
  Expr *pE, *pRight, *pExpr;
  u16 selFlags = p->selFlags;
  u32 elistFlags = 0;

  p->selFlags |= SF_Expanded;
  if( db->mallocFailed  ){
    return WRC_Abort;
  }
  assert( p->pSrc!=0 );
  if( (selFlags & SF_Expanded)!=0 ){
    return WRC_Prune;
  }
  pTabList = p->pSrc;
  pEList = p->pEList;
  sqlite3WithPush(pParse, p->pWith, 0);

  /* Make sure cursor numbers have been assigned to all entries in
  ** the FROM clause of the SELECT statement.
  */
  sqlite3SrcListAssignCursors(pParse, pTabList);

  /* Look up every table named in the FROM clause of the select.  If
  ** an entry of the FROM clause is a subquery instead of a table or view,
  ** then create a transient table structure to describe the subquery.
  */
  for(i=0, pFrom=pTabList->a; i<pTabList->nSrc; i++, pFrom++){
    Table *pTab;
    assert( pFrom->fg.isRecursive==0 || pFrom->pTab!=0 );
    if( pFrom->fg.isRecursive ) continue;
    assert( pFrom->pTab==0 );
#ifndef SQLITE_OMIT_CTE
    if( withExpand(pWalker, pFrom) ) return WRC_Abort;
    if( pFrom->pTab ) {} else
#endif
    if( pFrom->zName==0 ){
#ifndef SQLITE_OMIT_SUBQUERY
      Select *pSel = pFrom->pSelect;
      /* A sub-query in the FROM clause of a SELECT */
      assert( pSel!=0 );
      assert( pFrom->pTab==0 );
      if( sqlite3WalkSelect(pWalker, pSel) ) return WRC_Abort;
      if( sqlite3ExpandSubquery(pParse, pFrom) ) return WRC_Abort;
#endif
    }else{
      /* An ordinary table or view name in the FROM clause */
      assert( pFrom->pTab==0 );
      pFrom->pTab = pTab = sqlite3LocateTableItem(pParse, 0, pFrom);
      if( pTab==0 ) return WRC_Abort;
      if( pTab->nTabRef>=0xffff ){
        sqlite3ErrorMsg(pParse, "too many references to \"%s\": max 65535",
           pTab->zName);
        pFrom->pTab = 0;
        return WRC_Abort;
      }
      pTab->nTabRef++;
      if( !IsVirtual(pTab) && cannotBeFunction(pParse, pFrom) ){
        return WRC_Abort;
      }
#if !defined(SQLITE_OMIT_VIEW) || !defined (SQLITE_OMIT_VIRTUALTABLE)
      if( IsVirtual(pTab) || pTab->pSelect ){
        i16 nCol;
        if( sqlite3ViewGetColumnNames(pParse, pTab) ) return WRC_Abort;
        assert( pFrom->pSelect==0 );
        pFrom->pSelect = sqlite3SelectDup(db, pTab->pSelect, 0);
        nCol = pTab->nCol;
        pTab->nCol = -1;
        sqlite3WalkSelect(pWalker, pFrom->pSelect);
        pTab->nCol = nCol;
      }
#endif
    }

    /* Locate the index named by the INDEXED BY clause, if any. */
    if( sqlite3IndexedByLookup(pParse, pFrom) ){
      return WRC_Abort;
    }
  }

  /* Process NATURAL keywords, and ON and USING clauses of joins.
  */
  if( db->mallocFailed || sqliteProcessJoin(pParse, p) ){
    return WRC_Abort;
  }

  /* For every "*" that occurs in the column list, insert the names of
  ** all columns in all tables.  And for every TABLE.* insert the names
  ** of all columns in TABLE.  The parser inserted a special expression
  ** with the TK_ASTERISK operator for each "*" that it found in the column
  ** list.  The following code just has to locate the TK_ASTERISK
  ** expressions and expand each one to the list of all columns in
  ** all tables.
  **
  ** The first loop just checks to see if there are any "*" operators
  ** that need expanding.
  */
  for(k=0; k<pEList->nExpr; k++){
    pE = pEList->a[k].pExpr;
    if( pE->op==TK_ASTERISK ) break;
    assert( pE->op!=TK_DOT || pE->pRight!=0 );
    assert( pE->op!=TK_DOT || (pE->pLeft!=0 && pE->pLeft->op==TK_ID) );
    if( pE->op==TK_DOT && pE->pRight->op==TK_ASTERISK ) break;
    elistFlags |= pE->flags;
  }
  if( k<pEList->nExpr ){
    /*
    ** If we get here it means the result set contains one or more "*"
    ** operators that need to be expanded.  Loop through each expression
    ** in the result set and expand them one by one.
    */
    struct ExprList_item *a = pEList->a;
    ExprList *pNew = 0;
    int flags = pParse->db->flags;
    int longNames = (flags & SQLITE_FullColNames)!=0
                      && (flags & SQLITE_ShortColNames)==0;

    for(k=0; k<pEList->nExpr; k++){
      pE = a[k].pExpr;
      elistFlags |= pE->flags;
      pRight = pE->pRight;
      assert( pE->op!=TK_DOT || pRight!=0 );
      if( pE->op!=TK_ASTERISK
       && (pE->op!=TK_DOT || pRight->op!=TK_ASTERISK)
      ){
        /* This particular expression does not need to be expanded.
        */
        pNew = sqlite3ExprListAppend(pParse, pNew, a[k].pExpr);
        if( pNew ){
          pNew->a[pNew->nExpr-1].zName = a[k].zName;
          pNew->a[pNew->nExpr-1].zSpan = a[k].zSpan;
          a[k].zName = 0;
          a[k].zSpan = 0;
        }
        a[k].pExpr = 0;
      }else{
        /* This expression is a "*" or a "TABLE.*" and needs to be
        ** expanded. */
        int tableSeen = 0;      /* Set to 1 when TABLE matches */
        char *zTName = 0;       /* text of name of TABLE */
        if( pE->op==TK_DOT ){
          assert( pE->pLeft!=0 );
          assert( !ExprHasProperty(pE->pLeft, EP_IntValue) );
          zTName = pE->pLeft->u.zToken;
        }
        for(i=0, pFrom=pTabList->a; i<pTabList->nSrc; i++, pFrom++){
          Table *pTab = pFrom->pTab;
          Select *pSub = pFrom->pSelect;
          char *zTabName = pFrom->zAlias;
          const char *zSchemaName = 0;
          int iDb;
          if( zTabName==0 ){
            zTabName = pTab->zName;
          }
          if( db->mallocFailed ) break;
          if( pSub==0 || (pSub->selFlags & SF_NestedFrom)==0 ){
            pSub = 0;
            if( zTName && sqlite3StrICmp(zTName, zTabName)!=0 ){
              continue;
            }
            iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
            zSchemaName = iDb>=0 ? db->aDb[iDb].zDbSName : "*";
          }
          for(j=0; j<pTab->nCol; j++){
            char *zName = pTab->aCol[j].zName;
            char *zColname;  /* The computed column name */
            char *zToFree;   /* Malloced string that needs to be freed */
            Token sColname;  /* Computed column name as a token */

            assert( zName );
            if( zTName && pSub
             && sqlite3MatchSpanName(pSub->pEList->a[j].zSpan, 0, zTName, 0)==0
            ){
              continue;
            }

            /* If a column is marked as 'hidden', omit it from the expanded
            ** result-set list unless the SELECT has the SF_IncludeHidden
            ** bit set.
            */
            if( (p->selFlags & SF_IncludeHidden)==0
             && IsHiddenColumn(&pTab->aCol[j]) 
            ){
              continue;
            }
            tableSeen = 1;

            if( i>0 && zTName==0 ){
              if( (pFrom->fg.jointype & JT_NATURAL)!=0
                && tableAndColumnIndex(pTabList, i, zName, 0, 0)
              ){
                /* In a NATURAL join, omit the join columns from the 
                ** table to the right of the join */
                continue;
              }
              if( sqlite3IdListIndex(pFrom->pUsing, zName)>=0 ){
                /* In a join with a USING clause, omit columns in the
                ** using clause from the table on the right. */
                continue;
              }
            }
            pRight = sqlite3Expr(db, TK_ID, zName);
            zColname = zName;
            zToFree = 0;
            if( longNames || pTabList->nSrc>1 ){
              Expr *pLeft;
              pLeft = sqlite3Expr(db, TK_ID, zTabName);
              pExpr = sqlite3PExpr(pParse, TK_DOT, pLeft, pRight);
              if( zSchemaName ){
                pLeft = sqlite3Expr(db, TK_ID, zSchemaName);
                pExpr = sqlite3PExpr(pParse, TK_DOT, pLeft, pExpr);
              }
              if( longNames ){
                zColname = sqlite3MPrintf(db, "%s.%s", zTabName, zName);
                zToFree = zColname;
              }
            }else{
              pExpr = pRight;
            }
            pNew = sqlite3ExprListAppend(pParse, pNew, pExpr);
            sqlite3TokenInit(&sColname, zColname);
            sqlite3ExprListSetName(pParse, pNew, &sColname, 0);
            if( pNew && (p->selFlags & SF_NestedFrom)!=0 ){
              struct ExprList_item *pX = &pNew->a[pNew->nExpr-1];
              if( pSub ){
                pX->zSpan = sqlite3DbStrDup(db, pSub->pEList->a[j].zSpan);
                testcase( pX->zSpan==0 );
              }else{
                pX->zSpan = sqlite3MPrintf(db, "%s.%s.%s",
                                           zSchemaName, zTabName, zColname);
                testcase( pX->zSpan==0 );
              }
              pX->bSpanIsTab = 1;
            }
            sqlite3DbFree(db, zToFree);
          }
        }
        if( !tableSeen ){
          if( zTName ){
            sqlite3ErrorMsg(pParse, "no such table: %s", zTName);
          }else{
            sqlite3ErrorMsg(pParse, "no tables specified");
          }
        }
      }
    }
    sqlite3ExprListDelete(db, pEList);
    p->pEList = pNew;
  }
  if( p->pEList ){
    if( p->pEList->nExpr>db->aLimit[SQLITE_LIMIT_COLUMN] ){
      sqlite3ErrorMsg(pParse, "too many columns in result set");
      return WRC_Abort;
    }
    if( (elistFlags & (EP_HasFunc|EP_Subquery))!=0 ){
      p->selFlags |= SF_ComplexResult;
    }
  }
  return WRC_Continue;
}